

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprDeleteNN(sqlite3 *db,Expr *p)

{
  sqlite3 *in_RSI;
  Select *in_stack_ffffffffffffffe8;
  
  if (((ulong)in_RSI->pVfs & 0x80400000000000) == 0) {
    if ((in_RSI->pDfltColl != (CollSeq *)0x0) && (*(char *)&in_RSI->pVfs != -0x5a)) {
      sqlite3ExprDeleteNN(in_RSI,(Expr *)in_stack_ffffffffffffffe8);
    }
    if (in_RSI->mutex == (sqlite3_mutex *)0x0) {
      if (((ulong)in_RSI->pVfs & 0x80000000000) == 0) {
        sqlite3ExprListDelete(in_RSI,(ExprList *)in_stack_ffffffffffffffe8);
      }
      else {
        sqlite3SelectDelete(in_RSI,in_stack_ffffffffffffffe8);
      }
    }
    else {
      sqlite3ExprDeleteNN(in_RSI,(Expr *)in_stack_ffffffffffffffe8);
    }
    if (((ulong)in_RSI->pVfs & 0x100000000000000) != 0) {
      sqlite3WindowDelete(in_RSI,(Window *)in_stack_ffffffffffffffe8);
    }
  }
  if (((ulong)in_RSI->pVfs & 0x1000000000000) != 0) {
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  if (((ulong)in_RSI->pVfs & 0x800000000000) == 0) {
    sqlite3DbFreeNN(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ExprDeleteNN(sqlite3 *db, Expr *p){
  assert( p!=0 );
  /* Sanity check: Assert that the IntValue is non-negative if it exists */
  assert( !ExprHasProperty(p, EP_IntValue) || p->u.iValue>=0 );

  assert( !ExprHasProperty(p, EP_WinFunc) || p->y.pWin!=0 || db->mallocFailed );
  assert( p->op!=TK_FUNCTION || ExprHasProperty(p, EP_TokenOnly|EP_Reduced)
          || p->y.pWin==0 || ExprHasProperty(p, EP_WinFunc) );
#ifdef SQLITE_DEBUG
  if( ExprHasProperty(p, EP_Leaf) && !ExprHasProperty(p, EP_TokenOnly) ){
    assert( p->pLeft==0 );
    assert( p->pRight==0 );
    assert( p->x.pSelect==0 );
  }
#endif
  if( !ExprHasProperty(p, (EP_TokenOnly|EP_Leaf)) ){
    /* The Expr.x union is never used at the same time as Expr.pRight */
    assert( p->x.pList==0 || p->pRight==0 );
    if( p->pLeft && p->op!=TK_SELECT_COLUMN ) sqlite3ExprDeleteNN(db, p->pLeft);
    if( p->pRight ){
      sqlite3ExprDeleteNN(db, p->pRight);
    }else if( ExprHasProperty(p, EP_xIsSelect) ){
      sqlite3SelectDelete(db, p->x.pSelect);
    }else{
      sqlite3ExprListDelete(db, p->x.pList);
    }
    if( ExprHasProperty(p, EP_WinFunc) ){
      assert( p->op==TK_FUNCTION );
      sqlite3WindowDelete(db, p->y.pWin);
    }
  }
  if( ExprHasProperty(p, EP_MemToken) ) sqlite3DbFree(db, p->u.zToken);
  if( !ExprHasProperty(p, EP_Static) ){
    sqlite3DbFreeNN(db, p);
  }
}